

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O1

void __thiscall
ExecutorTest_LazyEvaluation_Test::~ExecutorTest_LazyEvaluation_Test
          (ExecutorTest_LazyEvaluation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, LazyEvaluation)
{
  std::string source = R"SRC(
  fn hang(): f32
  {
    ret hang();
  }

  fn main(): f32
  {
    let f: f32 = hang();
    ret 0;
  }
  )SRC";

  std::string expected = "";

  testProgram(source, expected, 0);
}